

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<float>::AutoFill(TPZMatrix<float> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  TPZMatrix<float> *pTVar1;
  bool bVar2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  TPZBaseMatrix *in_RDI;
  float a;
  double __x;
  double dVar6;
  double __x_00;
  double dVar7;
  float sum;
  float val;
  int64_t j;
  int64_t i;
  char *in_stack_00000178;
  char *in_stack_00000180;
  TPZMatrix<float> *pTVar8;
  undefined4 local_44;
  float local_40;
  undefined1 local_3c [4];
  float local_38;
  float local_34;
  TPZMatrix<float> *local_30;
  TPZMatrix<float> *local_28;
  int local_1c;
  
  local_1c = in_ECX;
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xd])(in_RDI,in_RSI,in_RDX);
  for (local_28 = (TPZMatrix<float> *)0x0; pTVar8 = local_28, iVar4 = TPZBaseMatrix::Rows(in_RDI),
      (long)pTVar8 < iVar4;
      local_28 = (TPZMatrix<float> *)
                 ((long)&(local_28->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1)) {
    local_38 = 0.0;
    local_30 = (TPZMatrix<float> *)0x0;
    if (local_1c != 0) {
      for (; pTVar1 = local_28, pTVar8 = local_30, (long)local_30 < (long)local_28;
          local_30 = (TPZMatrix<float> *)
                     ((long)&(local_30->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1))
      {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_30,local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,pTVar1,pTVar8,local_3c);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
        dVar6 = std::fabs(__x);
        local_38 = SUB84(dVar6,0) + local_38;
      }
    }
    while (pTVar8 = local_30, iVar4 = TPZBaseMatrix::Cols(in_RDI), (long)pTVar8 < iVar4) {
      local_34 = GetRandomVal(pTVar8);
      if (local_28 != local_30) {
        dVar6 = std::fabs((double)(ulong)(uint)local_34);
        local_38 = SUB84(dVar6,0) + local_38;
      }
      iVar3 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                        (in_RDI,local_28,local_30,&local_34);
      if (iVar3 == 0) {
        Error(in_stack_00000180,in_stack_00000178);
      }
      local_30 = (TPZMatrix<float> *)
                 ((long)&(local_30->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1);
    }
    iVar4 = TPZBaseMatrix::Rows(in_RDI);
    iVar5 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar4 == iVar5) {
      dVar6 = std::fabs((double)(ulong)(uint)local_38);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
      dVar7 = std::fabs(__x_00);
      if (SUB84(dVar7,0) < SUB84(dVar6,0)) {
        local_40 = local_38 + 1.0;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,&local_40);
      }
      bVar2 = IsZero(local_38);
      if (bVar2) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        bVar2 = IsZero(a);
        if (bVar2) {
          local_44 = 0x3f800000;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,&local_44);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}